

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnForward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *F,
          DecomposeType dec)

{
  undefined8 *puVar1;
  longdouble lVar2;
  uint uVar3;
  complex<long_double> *pcVar4;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  unkbyte10 in_ST0;
  unkbyte10 Var13;
  unkbyte10 in_ST1;
  unkbyte10 Var14;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  complex<long_double> __r;
  complex<long_double> udiag;
  complex<long_double> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  if (this->fSymmetric == EIsSymmetric) {
    if (0 < this->fNumEq) {
      uVar11 = 0;
      do {
        uVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar11];
        lVar12 = (long)(int)uVar3;
        pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        lVar8 = lVar12 * 0x20;
        lVar2 = *(longdouble *)(pcVar4[lVar12]._M_value + 0x10);
        if (*(longdouble *)pcVar4[lVar12]._M_value == (longdouble)0) {
          if ((lVar2 == (longdouble)0) && (!NAN(lVar2) && !NAN((longdouble)0))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
            poVar5 = (ostream *)std::ostream::operator<<(&std::cout,uVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," Equation = ",0xc);
            plVar6 = (long *)std::ostream::operator<<(poVar5,(int)uVar11);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            std::ostream::flush();
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                       ,0x8b);
          }
        }
        if (uVar11 == this->fNumEq - 1) {
          iVar7 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                       super_TPZVec<std::complex<long_double>_>.fNElements;
        }
        else {
          iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar11 + 1]
          ;
        }
        Var13 = in_ST0;
        Var14 = in_ST1;
        if ((dec & ~ELUPivot) == ELU) {
          lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                        [lVar12];
          if (((lVar9 < 0) ||
              ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar9))
             || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          Var13 = in_ST2;
          Var14 = in_ST3;
          in_ST2 = in_ST3;
          __divxc3();
          *(unkbyte10 *)pcVar4[lVar9]._M_value = in_ST0;
          *(unkbyte10 *)(pcVar4[lVar9]._M_value + 0x10) = in_ST1;
        }
        lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar12];
        local_38 = lVar8;
        if (((lVar9 < 0) ||
            ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar9)) ||
           ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = F->fElem + lVar9;
        local_58 = *(undefined8 *)pcVar4->_M_value;
        uStack_50 = *(undefined8 *)(pcVar4->_M_value + 8);
        puVar1 = (undefined8 *)(F->fElem[lVar9]._M_value + 0x10);
        local_48 = *puVar1;
        uStack_40 = puVar1[1];
        lVar8 = lVar12 + 1;
        if ((int)lVar8 < iVar7) {
          lVar9 = lVar8 * 0x20;
          iVar7 = ~uVar3 + iVar7;
          do {
            local_78._M_value._16_8_ = local_48;
            local_78._M_value._24_2_ = SUB82(uStack_40,0);
            local_78._M_value._26_6_ = SUB86((ulong)uStack_40 >> 0x10,0);
            local_78._M_value._0_8_ = local_58;
            local_78._M_value._8_2_ = SUB82(uStack_50,0);
            local_78._M_value._10_6_ = SUB86((ulong)uStack_50 >> 0x10,0);
            std::complex<long_double>::operator*=
                      (&local_78,
                       (complex<long_double> *)
                       (((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                         super_TPZVec<std::complex<long_double>_>.fStore)->_M_value + lVar9));
            lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar8];
            if (((lVar10 < 0) ||
                ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar10
                )) || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1
                      )) {
              TPZFMatrix<std::complex<long_double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar4 = F->fElem;
            lVar2 = *(longdouble *)(pcVar4[lVar10]._M_value + 0x10);
            *(longdouble *)pcVar4[lVar10]._M_value =
                 *(longdouble *)pcVar4[lVar10]._M_value -
                 (longdouble)CONCAT28(local_78._M_value._8_2_,local_78._M_value._0_8_);
            *(longdouble *)(pcVar4[lVar10]._M_value + 0x10) =
                 lVar2 - (longdouble)CONCAT28(local_78._M_value._24_2_,local_78._M_value._16_8_);
            lVar8 = lVar8 + 1;
            lVar9 = lVar9 + 0x20;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        in_ST0 = Var13;
        in_ST1 = Var14;
        if (dec == ELDLt) {
          lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                        [lVar12];
          if (((lVar8 < 0) ||
              ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar8))
             || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          in_ST0 = in_ST2;
          in_ST1 = in_ST3;
          in_ST2 = in_ST3;
          __divxc3();
          *(unkbyte10 *)pcVar4[lVar8]._M_value = Var13;
          *(unkbyte10 *)(pcVar4[lVar8]._M_value + 0x10) = Var14;
        }
        uVar11 = uVar11 + 1;
      } while ((long)uVar11 < (long)this->fNumEq);
    }
  }
  else if ((this->fSymmetric == EIsNonSymmetric) && (1 < this->fNumEq)) {
    uVar11 = 1;
    do {
      uVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar11];
      lVar8 = (long)(int)uVar3;
      pcVar4 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
               super_TPZVec<std::complex<long_double>_>.fStore;
      lVar2 = *(longdouble *)(pcVar4[lVar8]._M_value + 0x10);
      if (*(longdouble *)pcVar4[lVar8]._M_value == (longdouble)0) {
        if ((lVar2 == (longdouble)0) && (!NAN(lVar2) && !NAN((longdouble)0))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Diagonal Value = 0 >> Aborting on Index = ",0x2a);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cout,uVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," Equation = ",0xc);
          plVar6 = (long *)std::ostream::operator<<(poVar5,(int)uVar11);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0xa5);
        }
      }
      if (uVar11 == this->fNumEq - 1) {
        iVar7 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                     super_TPZVec<std::complex<long_double>_>.fNElements;
      }
      else {
        iVar7 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar11 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        lVar12 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
        if (((lVar12 < 0) ||
            ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar12))
           || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar4 = F->fElem;
        Var13 = in_ST3;
        Var14 = in_ST3;
        __divxc3();
        *(unkbyte10 *)pcVar4[lVar12]._M_value = in_ST0;
        *(unkbyte10 *)(pcVar4[lVar12]._M_value + 0x10) = in_ST1;
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = Var13;
        in_ST3 = Var14;
      }
      lVar12 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
      if (((lVar12 < 0) ||
          ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar12)) ||
         ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar4 = F->fElem + lVar12;
      local_58 = *(undefined8 *)pcVar4->_M_value;
      uStack_50 = *(undefined8 *)(pcVar4->_M_value + 8);
      puVar1 = (undefined8 *)(F->fElem[lVar12]._M_value + 0x10);
      local_48 = *puVar1;
      uStack_40 = puVar1[1];
      lVar8 = lVar8 + 1;
      if ((int)lVar8 < iVar7) {
        lVar12 = lVar8 * 0x20;
        iVar7 = ~uVar3 + iVar7;
        do {
          local_78._M_value._16_8_ = local_48;
          local_78._M_value._24_2_ = SUB82(uStack_40,0);
          local_78._M_value._26_6_ = SUB86((ulong)uStack_40 >> 0x10,0);
          local_78._M_value._0_8_ = local_58;
          local_78._M_value._8_2_ = SUB82(uStack_50,0);
          local_78._M_value._10_6_ = SUB86((ulong)uStack_50 >> 0x10,0);
          std::complex<long_double>::operator*=
                    (&local_78,
                     (complex<long_double> *)
                     (((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                       super_TPZVec<std::complex<long_double>_>.fStore)->_M_value + lVar12));
          lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8]
          ;
          if (((lVar9 < 0) ||
              ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar9))
             || ((F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar4 = F->fElem;
          lVar2 = *(longdouble *)(pcVar4[lVar9]._M_value + 0x10);
          *(longdouble *)pcVar4[lVar9]._M_value =
               *(longdouble *)pcVar4[lVar9]._M_value -
               (longdouble)CONCAT28(local_78._M_value._8_2_,local_78._M_value._0_8_);
          *(longdouble *)(pcVar4[lVar9]._M_value + 0x10) =
               lVar2 - (longdouble)CONCAT28(local_78._M_value._24_2_,local_78._M_value._16_8_);
          lVar8 = lVar8 + 1;
          lVar12 = lVar12 + 0x20;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      uVar11 = uVar11 + 2;
    } while ((int)uVar11 < this->fNumEq);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}